

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node<QPersistentModelIndex,_QEditorInfo> * __thiscall
QHashPrivate::iterator<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_>::node
          (iterator<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *this)

{
  Node<QPersistentModelIndex,_QEditorInfo> *pNVar1;
  int __c;
  char *in_RSI;
  Span<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *in_RDI;
  size_t in_stack_ffffffffffffffd8;
  
  span((iterator<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *)in_RDI);
  index((iterator<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *)in_RDI,in_RSI,__c);
  pNVar1 = Span<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_>::at
                     (in_RDI,in_stack_ffffffffffffffd8);
  return pNVar1;
}

Assistant:

inline Node *node() const noexcept
    {
        Q_ASSERT(!isUnused());
        return &d->spans[span()].at(index());
    }